

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

int __thiscall CLPIParser::compose(CLPIParser *this,uint8_t *buffer,int bufferSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  uint uVar6;
  int i;
  long lVar7;
  BitStreamWriter writer;
  BitStreamWriter local_68;
  long local_48;
  long local_40;
  long local_38;
  
  local_68.super_BitStream.m_totalBits = 0;
  local_68.super_BitStream.m_buffer = (uint *)0x0;
  local_68.super_BitStream.m_initBuffer = (uint *)0x0;
  lVar7 = 0;
  local_68.m_curVal = 0;
  local_68.m_bitWrited = 0;
  BitStream::setBuffer(&local_68.super_BitStream,buffer,buffer + bufferSize);
  local_68.m_curVal = 0;
  local_68.m_bitWrited = 0;
  do {
    BitStreamWriter::putBits(&local_68,8,(int)"HDMV"[lVar7]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  lVar7 = 0x35;
  do {
    BitStreamWriter::putBits(&local_68,8,(int)this->type_indicator[lVar7 + -0x30]);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x39);
  iVar5 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8;
  iVar1 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar5) {
    iVar1 = iVar5;
  }
  BitStreamWriter::putBits(&local_68,0x20,0);
  iVar5 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8;
  iVar2 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar5) {
    iVar2 = iVar5;
  }
  BitStreamWriter::putBits(&local_68,0x20,0);
  iVar5 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8;
  iVar3 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  local_48 = (long)(iVar3 >> 3);
  BitStreamWriter::putBits(&local_68,0x20,0);
  iVar5 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8;
  iVar3 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  local_40 = (long)(iVar3 >> 3);
  BitStreamWriter::putBits(&local_68,0x20,0);
  iVar5 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8;
  iVar3 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar5) {
    iVar3 = iVar5;
  }
  local_38 = (long)(iVar3 >> 3);
  BitStreamWriter::putBits(&local_68,0x20,0);
  iVar5 = 3;
  do {
    BitStreamWriter::putBits(&local_68,0x20,0);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  composeClipInfo(this,&local_68);
  uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + local_68.m_bitWrited;
  while ((uVar6 & 0x1f) != 0) {
    BitStreamWriter::putBits(&local_68,8,0);
    uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) *
            8 + local_68.m_bitWrited;
  }
  uVar4 = my_ntohl((int)uVar6 >> 3);
  *(uint32_t *)(buffer + (iVar1 >> 3)) = uVar4;
  composeSequenceInfo(this,&local_68);
  uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + local_68.m_bitWrited;
  while ((uVar6 & 0x1f) != 0) {
    BitStreamWriter::putBits(&local_68,8,0);
    uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) *
            8 + local_68.m_bitWrited;
  }
  uVar4 = my_ntohl((int)uVar6 >> 3);
  *(uint32_t *)(buffer + (iVar2 >> 3)) = uVar4;
  composeProgramInfo(this,&local_68,false);
  uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + local_68.m_bitWrited;
  while ((uVar6 & 0x1f) != 0) {
    BitStreamWriter::putBits(&local_68,8,0);
    uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) *
            8 + local_68.m_bitWrited;
  }
  uVar4 = my_ntohl((int)uVar6 >> 3);
  *(uint32_t *)(buffer + local_48) = uVar4;
  composeCPI(this,&local_68,false);
  uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + local_68.m_bitWrited;
  while ((uVar6 & 0x1f) != 0) {
    BitStreamWriter::putBits(&local_68,8,0);
    uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) *
            8 + local_68.m_bitWrited;
  }
  uVar4 = my_ntohl((int)uVar6 >> 3);
  *(uint32_t *)(buffer + local_40) = uVar4;
  BitStreamWriter::putBits(&local_68,0x20,0);
  uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + local_68.m_bitWrited;
  while ((uVar6 & 0x1f) != 0) {
    BitStreamWriter::putBits(&local_68,8,0);
    uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) *
            8 + local_68.m_bitWrited;
  }
  uVar4 = my_ntohl((int)uVar6 >> 3);
  *(uint32_t *)(buffer + local_38) = uVar4;
  composeExtentInfo(this,&local_68);
  uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + local_68.m_bitWrited;
  while ((uVar6 & 0x1f) != 0) {
    BitStreamWriter::putBits(&local_68,8,0);
    uVar6 = ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) *
            8 + local_68.m_bitWrited;
  }
  BitStreamWriter::flushBits(&local_68);
  iVar5 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8;
  iVar1 = local_68.m_bitWrited +
          ((int)local_68.super_BitStream.m_buffer - (int)local_68.super_BitStream.m_initBuffer) * 8
          + 7;
  if (-1 < iVar5) {
    iVar1 = iVar5;
  }
  return iVar1 >> 3;
}

Assistant:

int CLPIParser::compose(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    CLPIStreamInfo::writeString("HDMV", writer, 4);
    CLPIStreamInfo::writeString(version_number, writer, 4);
    const auto sequenceInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // sequenceInfo_start_address
    const auto programInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // programInfo_start_address
    const auto CPI_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // CPI start address
    const auto clipMark_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // clipMark
    const auto extentInfo_pos = reinterpret_cast<uint32_t*>(buffer + writer.getBitsCount() / 8);
    writer.putBits(32, 0);                              // extent info
    for (int i = 0; i < 3; i++) writer.putBits(32, 0);  // reserved_for_future_use

    composeClipInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);
    *sequenceInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeSequenceInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *programInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeProgramInfo(writer, false);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *CPI_pos = my_htonl(writer.getBitsCount() / 8);
    composeCPI(writer, false);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *clipMark_pos = my_htonl(writer.getBitsCount() / 8);
    composeClipMark(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    *extentInfo_pos = my_htonl(writer.getBitsCount() / 8);
    composeExtentInfo(writer);
    while (writer.getBitsCount() % 32 != 0) writer.putBits(8, 0);

    writer.flushBits();
    return writer.getBitsCount() / 8;
}